

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

int lytype_store(lys_module *mod,char *type_name,char **value_str,lyd_val *value)

{
  int iVar1;
  lys_revision *local_50;
  char *local_40;
  char *err_msg;
  lytype_plugin_list *p;
  lyd_val *value_local;
  char **value_str_local;
  char *type_name_local;
  lys_module *mod_local;
  
  local_40 = (char *)0x0;
  p = (lytype_plugin_list *)value;
  value_local = (lyd_val *)value_str;
  value_str_local = (char **)type_name;
  type_name_local = (char *)mod;
  if ((((mod != (lys_module *)0x0) && (type_name != (char *)0x0)) && (value_str != (char **)0x0)) &&
     (value != (lyd_val *)0x0)) {
    if (mod->rev_size == '\0') {
      local_50 = (lys_revision *)0x0;
    }
    else {
      local_50 = mod->rev;
    }
    err_msg = (char *)lytype_find(mod->name,local_50->date,type_name);
    if ((lytype_plugin_list *)err_msg == (lytype_plugin_list *)0x0) {
      mod_local._4_4_ = 1;
    }
    else {
      iVar1 = (*((lytype_plugin_list *)err_msg)->store_clb)
                        (*(ly_ctx **)type_name_local,(char *)value_str_local,(char **)value_local,
                         (lyd_val *)p,&local_40);
      if (iVar1 == 0) {
        mod_local._4_4_ = 0;
      }
      else if ((local_40 == (char *)0x0) &&
              (iVar1 = asprintf(&local_40,"Failed to store value \"%s\" of user type \"%s\".",
                                value_local->binary,value_str_local), iVar1 == -1)) {
        ly_log(*(ly_ctx **)type_name_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lytype_store");
        mod_local._4_4_ = -1;
      }
      else {
        ly_log(*(ly_ctx **)type_name_local,LY_LLERR,LY_EPLUGIN,local_40);
        free(local_40);
        mod_local._4_4_ = -1;
      }
    }
    return mod_local._4_4_;
  }
  __assert_fail("mod && type_name && value_str && value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/plugins.c"
                ,0x254,
                "int lytype_store(const struct lys_module *, const char *, const char **, lyd_val *)"
               );
}

Assistant:

int
lytype_store(const struct lys_module *mod, const char *type_name, const char **value_str, lyd_val *value)
{
    struct lytype_plugin_list *p;
    char *err_msg = NULL;

    assert(mod && type_name && value_str && value);

    p = lytype_find(mod->name, mod->rev_size ? mod->rev[0].date : NULL, type_name);
    if (p) {
        if (p->store_clb(mod->ctx, type_name, value_str, value, &err_msg)) {
            if (!err_msg) {
                if (asprintf(&err_msg, "Failed to store value \"%s\" of user type \"%s\".", *value_str, type_name) == -1) {
                    LOGMEM(mod->ctx);
                    return -1;
                }
            }
            LOGERR(mod->ctx, LY_EPLUGIN, err_msg);
            free(err_msg);
            return -1;
        }

        /* value successfully stored */
        return 0;
    }

    return 1;
}